

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::MatchSetNode::IsCharTrieArm(MatchSetNode *this,Compiler *compiler,uint *accNumAlts)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if ((this->isNegation == false) && ((this->set).rep.compact.countPlusOne - 1 < 5)) {
    uVar2 = CharSet<char16_t>::Count(&this->set);
    if (uVar2 == 0) {
      bVar3 = false;
    }
    else {
      uVar1 = *accNumAlts;
      *accNumAlts = uVar2 * uVar1;
      bVar3 = uVar2 * uVar1 < 0x11;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool MatchSetNode::IsCharTrieArm(Compiler& compiler, uint& accNumAlts) const
    {
        if (isNegation || !set.IsCompact())
            return false;
        const uint count = set.Count();
        if(count == 0)
            return false; // empty set always fails and consumes nothing, and therefore is not a char-trie arm
        accNumAlts *= count;
        if (accNumAlts > maxTrieArmExpansion)
            return false;
        return true;
    }